

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O3

void Pf_ManSetDefaultPars(Jf_Par_t *pPars)

{
  memset(&pPars->nReqTimeFlex,0,0xd8);
  pPars->nLutSize = 6;
  pPars->nCutNum = 0x10;
  pPars->nProcNum = 0;
  pPars->nRounds = 3;
  pPars->nRoundsEla = 0;
  pPars->nRelaxRatio = 0;
  pPars->nCoarseLimit = 3;
  pPars->nAreaTuner = 1;
  pPars->nVerbLimit = 5;
  pPars->DelayTarget = -1;
  pPars->fOptEdge = 1;
  pPars->fCutMin = 1;
  pPars->fPureAig = 0;
  pPars->fVeryVerbose = 0;
  pPars->nLutSizeMax = 6;
  pPars->nCutNumMax = 0x20;
  pPars->MapDelayTarget = -1.0;
  pPars->Epsilon = 0.01;
  return;
}

Assistant:

void Pf_ManSetDefaultPars( Jf_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Jf_Par_t) );
    pPars->nLutSize     =  6;
    pPars->nCutNum      = 16;
    pPars->nProcNum     =  0;
    pPars->nRounds      =  3;
    pPars->nRoundsEla   =  0;
    pPars->nRelaxRatio  =  0;
    pPars->nCoarseLimit =  3;
    pPars->nAreaTuner   =  1;
    pPars->nVerbLimit   =  5;
    pPars->DelayTarget  = -1;
    pPars->fAreaOnly    =  0;
    pPars->fOptEdge     =  1; 
    pPars->fCoarsen     =  0;
    pPars->fCutMin      =  1;
    pPars->fGenCnf      =  0;
    pPars->fPureAig     =  0;
    pPars->fVerbose     =  0;
    pPars->fVeryVerbose =  0;
    pPars->nLutSizeMax  =  PF_LEAF_MAX;
    pPars->nCutNumMax   =  PF_CUT_MAX;
    pPars->MapDelayTarget = -1;
    pPars->Epsilon      = (float)0.01;
}